

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

int64 __thiscall Bstrlib::String::parseInt(String *this,int base,int *endPos)

{
  uchar uVar1;
  uchar uVar2;
  uchar *puVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uchar *puVar8;
  int iVar9;
  char BASEText [17];
  char baseText [17];
  
  if ((this->super_tagbstring).slen == 0) {
    if (endPos != (int *)0x0) {
      *endPos = 0;
    }
    return 0;
  }
  puVar3 = (this->super_tagbstring).data;
  uVar1 = *puVar3;
  puVar8 = puVar3 + (uVar1 == '-');
  builtin_strncpy(baseText,"0123456789abcdef",0x11);
  builtin_strncpy(BASEText,"0123456789ABCDEF",0x11);
  if (base != 0) goto LAB_0010998c;
  if (*puVar8 != '0') {
    base = 10;
    goto LAB_0010998c;
  }
  uVar2 = puVar8[1];
  if (uVar2 == 'B') {
LAB_0010997e:
    puVar8 = puVar8 + 2;
    base = 2;
  }
  else {
    if (uVar2 != 'x') {
      if (uVar2 == 'b') goto LAB_0010997e;
      if (uVar2 != 'X') {
        puVar8 = puVar8 + 1;
        base = 8;
        goto LAB_0010998c;
      }
    }
    puVar8 = puVar8 + 2;
    base = 0x10;
  }
LAB_0010998c:
  iVar9 = (int)puVar8 - (int)puVar3;
  lVar7 = 0;
  while( true ) {
    uVar2 = *puVar8;
    pcVar4 = strchr(baseText,(int)(char)uVar2);
    iVar6 = (int)pcVar4 - (int)baseText;
    if ((10 < base) && (pcVar4 == (char *)0x0)) {
      pcVar4 = strchr(BASEText,(int)(char)uVar2);
      iVar6 = (int)pcVar4 - (int)BASEText;
    }
    if ((pcVar4 == (char *)0x0) || (base <= iVar6)) break;
    lVar7 = lVar7 * base + (long)iVar6;
    puVar8 = puVar8 + 1;
    iVar9 = iVar9 + 1;
  }
  if (endPos != (int *)0x0) {
    *endPos = iVar9;
  }
  lVar5 = -lVar7;
  if (uVar1 != '-') {
    lVar5 = lVar7;
  }
  return lVar5;
}

Assistant:

int64 String::parseInt(int base, int * endPos) const
    {
        const char * text = (const char*)data;
        if (!slen) { if (endPos) *endPos = 0; return 0; }
        bool negative = text[0] == '-';
        text += (int)negative;
        const char baseText[] = "0123456789abcdef", BASEText[] = "0123456789ABCDEF";

        // Check the current base, if auto detection is activated
        if (!base)
        {
            if (text[0] != '0') base = 10;
            else switch(text[1])
            {
            case 'X': case 'x': base = 16; text += 2; break;
            case 'B': case 'b': base = 2; text += 2; break;
            default: base = 8; text += 1; break;
            }
        }
        // Let's start conversion
        int64 ret = 0;
        while (text)
        {
            const char * charPos = strchr(baseText, *text);
            int digit = (int)(charPos - baseText);
            if (charPos == NULL && base > 10) { charPos = strchr(BASEText, *text); digit = (int)(charPos - BASEText); }
            if (charPos == NULL) break;
            if (digit >= base) break;
            ret = ret * base + digit;
            text++;
        }
        if (endPos) *endPos = (int)(text - (const char*)data);
        return negative ? -ret : ret;
    }